

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_map.h
# Opt level: O3

void __thiscall cppcms::impl::string_map::add(string_map *this,char *key,char *value)

{
  pointer peVar1;
  pointer peVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  byte bVar6;
  long lVar7;
  byte *pbVar8;
  pointer peVar9;
  int new_first;
  entry new_entry;
  allocator_type local_5d;
  int local_5c;
  vector<cppcms::impl::string_map::entry,_std::allocator<cppcms::impl::string_map::entry>_> local_58
  ;
  entry local_40;
  
  bVar6 = *key;
  if (bVar6 == 0) {
    local_40.hash = 0;
  }
  else {
    pbVar8 = (byte *)(key + 1);
    local_40.hash = 0;
    do {
      uVar3 = (uint)bVar6 + local_40.hash * 0x10;
      local_40.hash = uVar3 & 0xfffffff ^ uVar3 >> 0x18 & 0xfffffff0;
      bVar6 = *pbVar8;
      pbVar8 = pbVar8 + 1;
    } while (bVar6 != 0);
  }
  local_40.next_index = 0;
  lVar7 = (long)(this->data_).
                super__Vector_base<cppcms::impl::string_map::entry,_std::allocator<cppcms::impl::string_map::entry>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->data_).
                super__Vector_base<cppcms::impl::string_map::entry,_std::allocator<cppcms::impl::string_map::entry>_>
                ._M_impl.super__Vector_impl_data._M_start >> 3;
  local_40.key = key;
  local_40.value = value;
  if ((ulong)(lVar7 * -0x5555555555555555) <= this->total_ * 2) {
    local_5c = -1;
    std::vector<cppcms::impl::string_map::entry,_std::allocator<cppcms::impl::string_map::entry>_>::
    vector(&local_58,lVar7 * 0x5555555555555556,&local_5d);
    iVar4 = this->first_;
    peVar9 = (this->data_).
             super__Vector_base<cppcms::impl::string_map::entry,_std::allocator<cppcms::impl::string_map::entry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (iVar4 == -1) {
      iVar5 = -1;
    }
    else {
      do {
        insert(&local_58,peVar9 + iVar4,&local_5c);
        peVar9 = (this->data_).
                 super__Vector_base<cppcms::impl::string_map::entry,_std::allocator<cppcms::impl::string_map::entry>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        iVar4 = peVar9[iVar4].next_index;
        iVar5 = local_5c;
      } while (iVar4 != -1);
    }
    this->first_ = iVar5;
    peVar1 = (this->data_).
             super__Vector_base<cppcms::impl::string_map::entry,_std::allocator<cppcms::impl::string_map::entry>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    peVar2 = (this->data_).
             super__Vector_base<cppcms::impl::string_map::entry,_std::allocator<cppcms::impl::string_map::entry>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->data_).
    super__Vector_base<cppcms::impl::string_map::entry,_std::allocator<cppcms::impl::string_map::entry>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_58.
         super__Vector_base<cppcms::impl::string_map::entry,_std::allocator<cppcms::impl::string_map::entry>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (this->data_).
    super__Vector_base<cppcms::impl::string_map::entry,_std::allocator<cppcms::impl::string_map::entry>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_58.
         super__Vector_base<cppcms::impl::string_map::entry,_std::allocator<cppcms::impl::string_map::entry>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (this->data_).
    super__Vector_base<cppcms::impl::string_map::entry,_std::allocator<cppcms::impl::string_map::entry>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_58.
         super__Vector_base<cppcms::impl::string_map::entry,_std::allocator<cppcms::impl::string_map::entry>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_58.
    super__Vector_base<cppcms::impl::string_map::entry,_std::allocator<cppcms::impl::string_map::entry>_>
    ._M_impl.super__Vector_impl_data._M_start = peVar9;
    local_58.
    super__Vector_base<cppcms::impl::string_map::entry,_std::allocator<cppcms::impl::string_map::entry>_>
    ._M_impl.super__Vector_impl_data._M_finish = peVar1;
    local_58.
    super__Vector_base<cppcms::impl::string_map::entry,_std::allocator<cppcms::impl::string_map::entry>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = peVar2;
    if (peVar9 != (pointer)0x0) {
      operator_delete(peVar9);
    }
  }
  insert(&this->data_,&local_40,&this->first_);
  this->total_ = this->total_ + 1;
  return;
}

Assistant:

void add(char const *key,char const *value) {
				entry new_entry(key,value);
				if(total_ * 2 >= data_.size()) {
					int new_first = -1;
					std::vector<entry> new_data(data_.size()*2);
					for(iterator p = begin(),e = end();p!=e;++p) {
						insert(new_data,*p,new_first);
					}
					first_ = new_first;
					data_.swap(new_data);
				}
				insert(data_,new_entry,first_);
				total_++;
			}